

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O3

EStatusCode __thiscall CFFFileInput::ReadFDSelect(CFFFileInput *this,unsigned_short inFontIndex)

{
  CFFPrimitiveReader *this_00;
  ushort uVar1;
  EStatusCode EVar2;
  EStatusCode EVar3;
  long inNewOffset;
  void *pvVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  undefined6 in_register_00000032;
  bool bVar8;
  unsigned_short firstGlyphIndex;
  Byte fdIndex;
  Byte fdIndex_1;
  unsigned_short rangesCount;
  unsigned_short nextRangeGlyphIndex;
  Byte format;
  ushort local_3a;
  byte local_38;
  byte local_37;
  ushort local_36;
  ushort local_34;
  Byte local_31;
  
  inNewOffset = GetSingleIntegerValue(this,inFontIndex,0xc25,0);
  if (inNewOffset == 0) {
    EVar3 = eFailure;
  }
  else {
    iVar6 = (int)CONCAT62(in_register_00000032,inFontIndex);
    uVar1 = *(ushort *)((long)&this->mCharStrings->mCharStringsCount + (ulong)(uint)(iVar6 << 4));
    pvVar4 = operator_new__((ulong)((uint)uVar1 * 8));
    *(void **)((long)&this->mTopDictIndex->mFDSelect + (ulong)(uint)(iVar6 * 0x50)) = pvVar4;
    this_00 = &this->mPrimitivesReader;
    CFFPrimitiveReader::SetOffset(this_00,inNewOffset);
    CFFPrimitiveReader::ReadCard8(this_00,&local_31);
    if (local_31 == '\0') {
      if ((ulong)uVar1 == 0) {
        EVar3 = eSuccess;
      }
      else {
        uVar7 = 1;
        do {
          EVar3 = CFFPrimitiveReader::ReadCard8(this_00,&local_37);
          if (EVar3 == eFailure) goto LAB_0019ce40;
          *(ulong *)(*(long *)((long)&this->mTopDictIndex->mFDSelect + (ulong)(uint)(iVar6 * 0x50))
                     + -8 + uVar7 * 8) =
               (ulong)local_37 * 0x80 + (ulong)local_37 * 8 +
               *(long *)((long)&this->mTopDictIndex->mFDArray + (ulong)(uint)(iVar6 * 0x50));
        } while ((EVar3 == eSuccess) && (bVar8 = uVar7 < uVar1, uVar7 = uVar7 + 1, bVar8));
      }
    }
    else {
      EVar2 = CFFPrimitiveReader::ReadCard16(this_00,&local_36);
      EVar3 = eFailure;
      if ((EVar2 != eFailure) &&
         ((EVar3 = CFFPrimitiveReader::ReadCard16(this_00,&local_3a), EVar3 == eSuccess &&
          (local_36 != 0)))) {
        uVar7 = 0;
LAB_0019cd5c:
        CFFPrimitiveReader::ReadCard8(this_00,&local_38);
        CFFPrimitiveReader::ReadCard16(this_00,&local_34);
        EVar3 = CFFPrimitiveReader::GetInternalState(this_00);
        if (EVar3 != eFailure) goto code_r0x0019cd88;
        local_3a = local_34;
LAB_0019ce40:
        EVar3 = eFailure;
      }
    }
LAB_0019ce45:
    if (EVar3 == eSuccess) {
      EVar3 = CFFPrimitiveReader::GetInternalState(this_00);
    }
  }
  return EVar3;
code_r0x0019cd88:
  uVar5 = (ulong)local_3a;
  if (local_3a < local_34) {
    do {
      *(ulong *)(*(long *)((long)&this->mTopDictIndex->mFDSelect + (ulong)(uint)(iVar6 * 0x50)) +
                uVar5 * 8) =
           *(long *)((long)&this->mTopDictIndex->mFDArray + (ulong)(uint)(iVar6 * 0x50)) +
           (ulong)local_38 * 0x80 + (ulong)local_38 * 8;
      uVar5 = uVar5 + 1;
    } while (local_34 != uVar5);
  }
  local_3a = local_34;
  if ((EVar3 != eSuccess) || (uVar7 = uVar7 + 1, local_36 <= uVar7)) goto LAB_0019ce45;
  goto LAB_0019cd5c;
}

Assistant:

EStatusCode CFFFileInput::ReadFDSelect(unsigned short inFontIndex)
{
	LongFilePositionType fdSelectLocation = GetFDSelectPosition(inFontIndex);
	unsigned short glyphCount = mCharStrings[inFontIndex].mCharStringsCount;
	EStatusCode status = PDFHummus::eSuccess;
	Byte format;

	// supposed to get here only for CIDs. and they must have an FDSelect...so if it doesn't - fail
	if(0 == fdSelectLocation)
		return PDFHummus::eFailure;

	mTopDictIndex[inFontIndex].mFDSelect = new FontDictInfo*[glyphCount];
	mPrimitivesReader.SetOffset(fdSelectLocation);

	mPrimitivesReader.ReadCard8(format);
	if(0 == format)
	{
		Byte fdIndex;

		for(unsigned long i=0; i < glyphCount && PDFHummus::eSuccess == status; ++i)
		{
			status = mPrimitivesReader.ReadCard8(fdIndex);
			if(status != PDFHummus::eFailure)
				mTopDictIndex[inFontIndex].mFDSelect[i] = mTopDictIndex[inFontIndex].mFDArray+ fdIndex;
		}
	}
	else // format 3
	{
		unsigned short rangesCount;
		unsigned short firstGlyphIndex;
		unsigned short nextRangeGlyphIndex;
		Byte fdIndex;

		status = mPrimitivesReader.ReadCard16(rangesCount);
		if(status != PDFHummus::eFailure)
		{
			status = mPrimitivesReader.ReadCard16(firstGlyphIndex);
			for(unsigned long i=0; i < rangesCount && PDFHummus::eSuccess == status;++i)
			{
				mPrimitivesReader.ReadCard8(fdIndex);
				mPrimitivesReader.ReadCard16(nextRangeGlyphIndex);
				status = mPrimitivesReader.GetInternalState();
				if(status != PDFHummus::eFailure)
					for(unsigned short j=firstGlyphIndex; j < nextRangeGlyphIndex;++j)
						mTopDictIndex[inFontIndex].mFDSelect[j] = 
							mTopDictIndex[inFontIndex].mFDArray + fdIndex;
				firstGlyphIndex = nextRangeGlyphIndex;
			}
		}
	}

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();
}